

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValueIndex
          (HtmlparserCppTest *this,string *expected_value_index)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool bVar2;
  int iVar3;
  char *in_RAX;
  int *piVar4;
  long lVar5;
  HtmlParser *this_00;
  const_iterator cVar6;
  mapped_type *ppHVar7;
  undefined8 extraout_RAX;
  string *psVar8;
  HtmlparserCppTest *__nptr;
  HtmlparserCppTest *this_01;
  pointer this_02;
  _Alloc_hider *unaff_R12;
  int unaff_R14D;
  pointer str_00;
  char *error_pos;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_88;
  HtmlparserCppTest *pHStack_70;
  undefined1 *puStack_68;
  _Alloc_hider local_28;
  
  psVar8 = (string *)&local_28;
  if (expected_value_index->_M_string_length == 0) {
    bVar2 = false;
    __nptr = this;
  }
  else {
    local_28._M_p = in_RAX;
    piVar4 = __errno_location();
    *piVar4 = 0;
    __nptr = (HtmlparserCppTest *)(expected_value_index->_M_dataplus)._M_p;
    lVar5 = strtol((char *)__nptr,&local_28._M_p,10);
    unaff_R14D = (int)lVar5;
    expected_value_index = psVar8;
    if (*local_28._M_p == '\0') {
      bVar2 = *piVar4 == 0;
      unaff_R12 = &local_28;
    }
    else {
      bVar2 = false;
      unaff_R12 = &local_28;
    }
  }
  if (bVar2) {
    __nptr = (HtmlparserCppTest *)(this->parser_).parser_;
    iVar3 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)__nptr);
    if (unaff_R14D == iVar3) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar2 = StringToBool(expected_value_index);
  this_01 = (HtmlparserCppTest *)(__nptr->parser_).parser_;
  iVar3 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)this_01);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_88.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_88.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_88.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_70 = __nptr;
  puStack_68 = (undefined1 *)unaff_R12;
  SplitStringIntoKeyValuePairs(expected_value_index,"=",",",&vStack_88);
  if (vStack_88.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_88.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(this_01->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_88.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        ValidateState(this_01,str);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if (iVar3 == 0) {
          ValidateTag(this_01,str);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)str_00);
          if (iVar3 == 0) {
            ValidateAttribute(this_01,str);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)str_00);
            if (iVar3 == 0) {
              ValidateValue(this_01,str);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)str_00);
              if (iVar3 == 0) {
                ValidateAttributeType(this_01,str);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)str_00);
                if (iVar3 == 0) {
                  ValidateAttributeQuoted(this_01,str);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar3 == 0) {
                    ValidateInJavascript(this_01,str);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar3 == 0) {
                      ValidateJavascriptQuoted(this_01,str);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar3 == 0) {
                        ValidateJavascriptState(this_01,str);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar3 == 0) {
                          ValidateInCss(this_01,str);
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar3 == 0) {
                            ValidateLine(this_01,str);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar3 == 0) {
                              ValidateColumn(this_01,str);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar3 == 0) {
                                ValidateValueIndex(this_01,str);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar3 == 0) {
                                  ValidateIsUrlStart(this_01,str);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar3 == 0) {
                                    cVar6 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)this_01,str);
                                    if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar7 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&this_01->contextMap,str);
                                      *ppHVar7 = this_00;
                                    }
                                    ppHVar7 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&this_01->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar7,&this_01->parser_);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar3 == 0) {
                                      cVar6 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)this_01,str);
                                      if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_88);
                                        _Unwind_Resume(extraout_RAX);
                                      }
                                      ppHVar7 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&this_01->contextMap,str);
                                      HtmlParser::CopyFrom(&this_01->parser_,*ppHVar7);
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar3 == 0) {
                                        bVar2 = StringToBool(str);
                                        if (bVar2) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((this_01->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_02 = str_00;
                                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar3 == 0) {
                                          iVar3 = NameToId((HtmlparserCppTest *)this_02,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((this_01->parser_).parser_,iVar3);
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar3 != 0) goto LAB_0010784b;
                                          bVar2 = StringToBool(str);
                                          if (bVar2) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((this_01->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_88.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_88);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateValueIndex(const string &expected_value_index) {
  int index;
  CHECK(safe_strto32(expected_value_index, &index));
  EXPECT_EQ(index, parser_.ValueIndex())
      << "Unexpected value_index value at line " << parser_.line_number();
}